

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerProfiledNewScArray(Lowerer *this,JitProfilingInstr *arrInstr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  IntConstOpnd *opndArg;
  AddrOpnd *opndArg_00;
  Opnd *opndArg_01;
  HelperCallOpnd *this_01;
  undefined4 *puVar5;
  
  pIVar1 = (arrInstr->super_Instr).m_prev;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateProfileIdOpnd(arrInstr->profileId,this->m_func);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,&opndArg->super_Opnd);
  opndArg_00 = CreateFunctionBodyOpnd(this,(arrInstr->super_Instr).m_func);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,&opndArg_00->super_Opnd);
  opndArg_01 = IR::Instr::UnlinkSrc1(&arrInstr->super_Instr);
  LowererMD::LoadHelperArgument(this_00,&arrInstr->super_Instr,opndArg_01);
  this_01 = IR::HelperCallOpnd::New(HelperProfiledNewScArray,this->m_func);
  if ((arrInstr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005ca3cd;
    *puVar5 = 0;
  }
  func = (arrInstr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005ca3cd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (HelperCallOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  (arrInstr->super_Instr).m_src1 = &this_01->super_Opnd;
  LowererMD::LowerCall(this_00,&arrInstr->super_Instr,0);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerProfiledNewScArray(IR::JitProfilingInstr* arrInstr)
{
    IR::Instr *instrPrev = arrInstr->m_prev;

    /*
        JavascriptArray *ProfilingHelpers::ProfiledNewScArray(
            const uint length,
            FunctionBody *const functionBody,
            const ProfileId profileId)
    */

    m_lowererMD.LoadHelperArgument(arrInstr, IR::Opnd::CreateProfileIdOpnd(arrInstr->profileId, m_func));
    m_lowererMD.LoadHelperArgument(arrInstr, CreateFunctionBodyOpnd(arrInstr->m_func));
    m_lowererMD.LoadHelperArgument(arrInstr, arrInstr->UnlinkSrc1());
    arrInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledNewScArray, m_func));
    m_lowererMD.LowerCall(arrInstr, 0);

    return instrPrev;
}